

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int bio_read_intern(BIO *b,void *data,size_t dlen,size_t *readbytes)

{
  long lVar1;
  ulong *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_stack_00000010;
  size_t *in_stack_00000018;
  int ret;
  ulong *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ulong *puVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_RDI == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0);
    ERR_set_error(0x20,0xc0102,(char *)0x0);
    iVar3 = -1;
  }
  else if ((*(long *)(in_RDI + 8) == 0) || (*(long *)(*(long *)(in_RDI + 8) + 0x20) == 0)) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0);
    ERR_set_error(0x20,0x79,(char *)0x0);
    iVar3 = -2;
  }
  else {
    if ((*(long *)(in_RDI + 0x10) != 0) || (*(long *)(in_RDI + 0x18) != 0)) {
      in_stack_ffffffffffffffc0 = (ulong *)0x0;
      lVar1 = bio_call_callback((BIO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                ,(int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                                (int)((ulong)in_RCX >> 0x20),
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_00000010,in_stack_00000018);
      in_stack_ffffffffffffffd4 = (int)lVar1;
      if (in_stack_ffffffffffffffd4 < 1) {
        return in_stack_ffffffffffffffd4;
      }
    }
    if (*(int *)(in_RDI + 0x28) == 0) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0);
      ERR_set_error(0x20,0x78,(char *)0x0);
      iVar3 = -1;
    }
    else {
      iVar3 = (**(code **)(*(long *)(in_RDI + 8) + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX);
      if (0 < iVar3) {
        *(ulong *)(in_RDI + 0x60) = *in_RCX + *(long *)(in_RDI + 0x60);
      }
      puVar2 = in_RCX;
      if ((*(long *)(in_RDI + 0x10) != 0) || (*(long *)(in_RDI + 0x18) != 0)) {
        lVar1 = bio_call_callback((BIO *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),
                                  (int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                                  (int)((ulong)in_RCX >> 0x20),
                                  CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_00000010,
                                  in_stack_00000018);
        iVar3 = (int)lVar1;
        in_stack_ffffffffffffffc0 = in_RCX;
      }
      if ((0 < iVar3) && (in_RDX < *puVar2)) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                      (char *)in_stack_ffffffffffffffc0);
        ERR_set_error(0x20,0xc0103,(char *)0x0);
        iVar3 = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int bio_read_intern(BIO *b, void *data, size_t dlen, size_t *readbytes)
{
    int ret;

    if (b == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        return -1;
    }
    if (b->method == NULL || b->method->bread == NULL) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNSUPPORTED_METHOD);
        return -2;
    }

    if (HAS_CALLBACK(b) &&
        ((ret = (int)bio_call_callback(b, BIO_CB_READ, data, dlen, 0, 0L, 1L,
                                       NULL)) <= 0))
        return ret;

    if (!b->init) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNINITIALIZED);
        return -1;
    }

    ret = b->method->bread(b, data, dlen, readbytes);

    if (ret > 0)
        b->num_read += (uint64_t)*readbytes;

    if (HAS_CALLBACK(b))
        ret = (int)bio_call_callback(b, BIO_CB_READ | BIO_CB_RETURN, data,
                                     dlen, 0, 0L, ret, readbytes);

    /* Shouldn't happen */
    if (ret > 0 && *readbytes > dlen) {
        ERR_raise(ERR_LIB_BIO, ERR_R_INTERNAL_ERROR);
        return -1;
    }

    return ret;
}